

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::MarkUsedBlocks(void)

{
  long lVar1;
  long lVar2;
  void *ptr;
  ExecutorX86 *pEVar3;
  uint uVar4;
  uint hash;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  char *basePtr;
  uint uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint value;
  int iVar13;
  uint *puVar14;
  ulong uVar15;
  bool bVar16;
  void *unknownExec;
  ExecutorX86 *local_58;
  uint local_4c;
  long local_48;
  int *local_40;
  ulong local_38;
  
  local_48 = *(long *)(NULLC::commonLinker + 0x240);
  lVar1 = *(long *)(NULLC::commonLinker + 0x200);
  lVar2 = *(long *)(NULLC::commonLinker + 0x230);
  if (DAT_0024c0e8 == (void *)0x0) {
    if (_DAT_0024c0f0 == (long *)0x0) {
      DAT_0024c0e8 = (void *)(*(code *)NULLC::alloc)(0x2004);
    }
    else {
      DAT_0024c0e8 = (void *)(**(code **)(*_DAT_0024c0f0 + 0x10))();
    }
    memset(DAT_0024c0e8,0,0x2000);
  }
  _DAT_0024c0d8 = functionIDs;
  uVar15 = 0;
  _DAT_0024c0e0 = 0xffc;
  if (functionIDs != 0) {
    _DAT_0024c0e0 = 0;
  }
  memset(DAT_0024c0e8,0,0x2000);
  curr = &rootsA;
  next = &rootsB;
  _DAT_0024c0ac = 0;
  _DAT_0024c0bc = 0;
  local_58 = (ExecutorX86 *)0x0;
  uVar4 = nullcGetCurrentExecutor(&local_58);
  if ((uVar4 != 2) && (*(int *)(NULLC::commonLinker + 0x23c) != 0)) {
    puVar14 = (uint *)(lVar2 + 0xc);
    uVar11 = 0;
    do {
      CheckVariable((char *)((ulong)*puVar14 + (long)unmanageableBase),
                    (ExternTypeInfo *)((ulong)puVar14[-1] * 0x50 + lVar1));
      uVar11 = uVar11 + 1;
      puVar14 = puVar14 + 4;
    } while (uVar11 < *(uint *)(NULLC::commonLinker + 0x23c));
  }
  uVar8 = *(uint *)(NULLC::commonLinker + 0x750);
  local_40 = (int *)(local_48 + 8);
  local_4c = uVar4;
  do {
    hash = 0;
    if (uVar4 == 1) {
      hash = ExecutorX86::GetCallStackAddress(local_58,(uint)uVar15);
      uVar15 = (ulong)((uint)uVar15 + 1);
    }
    if (uVar4 == 0) {
      hash = ExecutorRegVm::GetCallStackAddress((ExecutorRegVm *)local_58,(uint)uVar15);
      uVar15 = (ulong)((uint)uVar15 + 1);
    }
    if (hash != 0) {
      for (puVar14 = *(uint **)((long)DAT_0024c0e8 + (ulong)(hash & 0x3ff) * 8);
          puVar14 != (uint *)0x0; puVar14 = *(uint **)(puVar14 + 2)) {
        if (*puVar14 == hash) goto LAB_001406c5;
      }
      puVar14 = (uint *)0x0;
LAB_001406c5:
      if (puVar14 == (uint *)0x0) {
        uVar12 = 0xffffffff;
        value = 0xffffffff;
        if ((ulong)*(uint *)(NULLC::commonLinker + 0x24c) != 0) {
          uVar11 = 0;
          piVar9 = local_40;
          do {
            if ((piVar9[-1] <= (int)hash) && (value = uVar12, (int)hash < piVar9[-1] + *piVar9)) {
              value = (uint)uVar11;
              uVar12 = (uint)uVar11;
            }
            uVar11 = uVar11 + 1;
            piVar9 = piVar9 + 0x25;
          } while (*(uint *)(NULLC::commonLinker + 0x24c) != uVar11);
        }
        HashMap<int>::insert((HashMap<int> *)&functionIDs,hash,value);
      }
      else {
        value = puVar14[1];
      }
      if (value != 0xffffffff) {
        lVar5 = (long)(int)value * 0x94;
        lVar2 = local_48 + lVar5;
        uVar4 = uVar8 + 0xf;
        if (-1 < (int)uVar8) {
          uVar4 = uVar8;
        }
        iVar10 = uVar8 - (uVar4 & 0xfffffff0);
        iVar13 = 0x10 - iVar10;
        if (iVar10 == 0) {
          iVar13 = 0;
        }
        iVar13 = iVar13 + uVar8;
        iVar10 = *(int *)(local_48 + 0x68 + lVar5);
        local_38 = uVar15;
        if (*(int *)(local_48 + 0x58 + lVar5) != 0) {
          uVar4 = 0;
          do {
            uVar8 = *(int *)(lVar2 + 0x50) + uVar4;
            if (*(uint *)(NULLC::commonLinker + 0x27c) <= uVar8) {
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x7f,
                            "T &FastVector<ExternLocalInfo>::operator[](unsigned int) [T = ExternLocalInfo, zeroNewMemory = false, skipConstructor = false]"
                           );
            }
            lVar5 = (ulong)uVar8 * 0x1c;
            CheckVariable((char *)((long)unmanageableBase +
                                  (ulong)*(uint *)(*(long *)(NULLC::commonLinker + 0x270) + 0xc +
                                                  lVar5) + (long)iVar13),
                          (ExternTypeInfo *)
                          ((ulong)*(uint *)(*(long *)(NULLC::commonLinker + 0x270) + 4 + lVar5) *
                           0x50 + lVar1));
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(lVar2 + 0x58));
        }
        if (*(int *)(lVar2 + 0x4c) != -1) {
          CheckPointer((char *)((long)unmanageableBase +
                               (ulong)*(uint *)(lVar2 + 100) + (long)iVar13 + -8));
        }
        uVar8 = (iVar10 + 0xfU & 0xfffffff0) + iVar13;
        uVar15 = local_38;
        uVar4 = local_4c;
      }
    }
    pEVar3 = local_58;
  } while (hash != 0);
  if (uVar4 == 1) {
    puVar6 = (undefined8 *)ExecutorX86::GetStackStart(local_58);
    puVar7 = (undefined8 *)ExecutorX86::GetStackEnd(pEVar3);
  }
  else {
    puVar6 = (undefined8 *)0x0;
    puVar7 = (undefined8 *)0x0;
  }
  pEVar3 = local_58;
  if (uVar4 == 0) {
    puVar6 = (undefined8 *)ExecutorRegVm::GetStackStart((ExecutorRegVm *)local_58);
    puVar7 = (undefined8 *)ExecutorRegVm::GetStackEnd((ExecutorRegVm *)pEVar3);
  }
  if (puVar7 < puVar6) {
    __assert_fail("tempStackTop >= tempStackBase",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                  ,0x493,"void GC::MarkUsedBlocks()");
  }
LAB_001408e1:
  if (puVar7 < puVar6 + 1) {
    MarkPendingRoots();
    return;
  }
  ptr = (void *)*puVar6;
  if (((void *)0x10000 < ptr) && ((ptr < unmanageableBase || (unmanageableTop < ptr))))
  goto LAB_001408a4;
  goto LAB_001408dd;
LAB_001408a4:
  basePtr = (char *)NULLC::GetBasePointer(ptr);
  if (basePtr == (char *)0x0) {
    bVar16 = true;
  }
  else {
    uVar15 = *(ulong *)(basePtr + -8);
    bVar16 = (uVar15 & 2) == 0;
    if (bVar16) {
      if ((uVar15 & 1) == 0) {
        *(ulong *)(basePtr + -8) = uVar15 | 1;
        CheckBasePointer(basePtr);
      }
    }
    else {
      puVar6 = (undefined8 *)((long)puVar6 + 4);
    }
  }
  if (bVar16) {
LAB_001408dd:
    puVar6 = (undefined8 *)((long)puVar6 + 4);
  }
  goto LAB_001408e1;
}

Assistant:

void GC::MarkUsedBlocks()
{
	GC_DEBUG_PRINT("Unmanageable range: %p-%p\n", GC::unmanageableBase, GC::unmanageableTop);

	// Get information about programs' functions, variables, types and symbols (for debug output)
	ExternFuncInfo	*functions = NULLC::commonLinker->exFunctions.data;
	ExternVarInfo	*vars = NULLC::commonLinker->exVariables.data;
	ExternTypeInfo	*types = NULLC::commonLinker->exTypes.data;
	char			*symbols = NULLC::commonLinker->exSymbols.data;
	(void)symbols;

	GC::functionIDs.init();
	GC::functionIDs.clear();

	GC::curr = &GC::rootsA;
	GC::next = &GC::rootsB;
	GC::curr->clear();
	GC::next->clear();

	// To check every stack frame, we have to get it first. But we have multiple executors, so flow alternates depending on which executor we are running
	void *unknownExec = NULL;
	unsigned int execID = nullcGetCurrentExecutor(&unknownExec);

	if(execID != NULLC_LLVM)
	{
		// Mark global variables
		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(GC::unmanageableBase + vars[i].offset, types[vars[i].type]);
		}
	}
	else
	{
#ifdef NULLC_LLVM_SUPPORT
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;

		unsigned count = 0;
		char *data = exec->GetVariableData(&count);

		for(unsigned int i = 0; i < NULLC::commonLinker->exVariables.size(); i++)
		{
			GC_DEBUG_PRINT("Global %s %s (with offset of %d)\n", symbols + types[vars[i].type].offsetToName, symbols + vars[i].offsetToName, vars[i].offset);
			GC::CheckVariable(data + vars[i].offset, types[vars[i].type]);
		}
#endif
	}

	// Starting stack offset is equal to global variable size
	int offset = NULLC::commonLinker->globalVarSize;

	// Init stack trace
	unsigned currentFrame = 0;

	// Mark local variables
	while(true)
	{
		int address = 0;

		// Get next address from call stack

#ifdef NULLC_BUILD_X86_JIT
		if(execID == NULLC_X86)
		{
			ExecutorX86 *exec = (ExecutorX86*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

#ifdef NULLC_LLVM_SUPPORT
		if(execID == NULLC_LLVM)
		{
			ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}
#endif

		if(execID == NULLC_REG_VM)
		{
			ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
			address = exec->GetCallStackAddress(currentFrame++);
		}

		// If failed, exit
		if(address == 0)
			break;

		// Find corresponding function
		int *cachedFuncID = GC::functionIDs.find(address);

		int funcID = -1;
		if(cachedFuncID)
		{
			funcID = *cachedFuncID;
		}
		else
		{
			for(unsigned i = 0; i < NULLC::commonLinker->exFunctions.size(); i++)
			{
				if(address >= functions[i].regVmAddress && address < (functions[i].regVmAddress + functions[i].regVmCodeSize))
					funcID = i;
			}

			GC::functionIDs.insert(address, funcID);
		}

		// If we are not in global scope
		if(funcID != -1)
		{
			ExternFuncInfo &function = functions[funcID];

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;
			GC_DEBUG_PRINT("In function %s (with offset of %d)\n", symbols + function.offsetToName, alignOffset);

			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			// Check every function local
			for(unsigned i = 0; i < function.localCount; i++)
			{
				// Get information about local
				ExternLocalInfo &lInfo = NULLC::commonLinker->exLocals[function.offsetToFirstLocal + i];

				GC_DEBUG_PRINT("Local %s %s (with offset of %d+%d)\n", symbols + types[lInfo.type].offsetToName, symbols + lInfo.offsetToName, offset, lInfo.offset);
				// Check it
				GC::CheckVariable(GC::unmanageableBase + offset + lInfo.offset, types[lInfo.type]);
			}

			if(function.contextType != ~0u)
			{
				GC_DEBUG_PRINT("Local %s $context (with offset of %d+%d)\n", symbols + types[function.contextType].offsetToName, offset, function.argumentSize - NULLC_PTR_SIZE);
				char *ptr = GC::unmanageableBase + offset + function.argumentSize - NULLC_PTR_SIZE;
				GC::CheckPointer(ptr);
			}

			offset += stackSize;

			GC_DEBUG_PRINT("Moving offset to next frame by %d bytes\n", stackSize);
		}
	}

	// Check for pointers in stack
	char *tempStackBase = NULL, *tempStackTop = NULL;

#ifdef NULLC_BUILD_X86_JIT
	if(execID == NULLC_X86)
	{
		ExecutorX86 *exec = (ExecutorX86*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

#ifdef NULLC_LLVM_SUPPORT
	if(execID == NULLC_LLVM)
	{
		ExecutorLLVM *exec = (ExecutorLLVM*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}
#endif

	if(execID == NULLC_REG_VM)
	{
		ExecutorRegVm *exec = (ExecutorRegVm*)unknownExec;
		tempStackBase = (char*)exec->GetStackStart();
		tempStackTop = (char*)exec->GetStackEnd();
	}

	GC_DEBUG_PRINT("Check stack from %p to %p\n", tempStackBase, tempStackTop);

	// Check that temporary stack range is correct
	assert(tempStackTop >= tempStackBase);

	// Check temporary stack for pointers
	while(tempStackBase + sizeof(void*) <= tempStackTop)
	{
		char *ptr = GC::ReadVmMemoryPointer(tempStackBase);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(ptr > (char*)0x00010000 && (ptr < GC::unmanageableBase || ptr > GC::unmanageableTop))
		{
			// Get pointer base
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(ptr);
			// If there is no base, this pointer points to memory that is not GCs memory
			if(basePtr)
			{
				GC_DEBUG_PRINT("\tGlobal pointer [stack] %p\n", ptr);

				GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

				markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));

				// Might step on a left-over pointer in stale registers
				if(*marker & OBJECT_FREED)
				{
					tempStackBase += 4;
					continue;
				}

				GC::PrintMarker(*marker);

				// If block is unmarked, mark it as used
				if(!(*marker & OBJECT_VISIBLE))
				{
					*marker |= OBJECT_VISIBLE;

					GC_DEBUG_PRINT("\tMarked as used, checking content\n");

					GC::CheckBasePointer((char*)basePtr);
				}
			}
		}
		tempStackBase += 4;
	}

	GC::MarkPendingRoots();
}